

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

bool __thiscall wasm::anon_unknown_0::RecGroupEquator::eq(RecGroupEquator *this,Type a,Type b)

{
  bool bVar1;
  TypeInfo *a_00;
  TypeInfo *b_00;
  RecGroupEquator *this_local;
  Type b_local;
  Type a_local;
  
  this_local = (RecGroupEquator *)b.id;
  b_local = a;
  bVar1 = wasm::Type::isBasic(&b_local);
  if ((!bVar1) && (bVar1 = wasm::Type::isBasic((Type *)&this_local), !bVar1)) {
    a_00 = getTypeInfo(b_local);
    b_00 = getTypeInfo((Type)this_local);
    bVar1 = eq(this,a_00,b_00);
    return bVar1;
  }
  bVar1 = wasm::Type::operator==(&b_local,(Type *)&this_local);
  return bVar1;
}

Assistant:

bool RecGroupEquator::eq(Type a, Type b) const {
  if (a.isBasic() || b.isBasic()) {
    return a == b;
  }
  return eq(*getTypeInfo(a), *getTypeInfo(b));
}